

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::append(QString *this,QLatin1StringView str)

{
  qsizetype qVar1;
  DataPointer *d;
  char16_t *out;
  QLatin1 *this_00;
  char *strData;
  QLatin1StringView in;
  QLatin1StringView other;
  
  in.m_data = (char *)str.m_size;
  out = (char16_t *)str.m_data;
  if ((long)in.m_data < 1 || out == (char16_t *)0x0) {
    if ((out != (char16_t *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      qVar1 = QtPrivate::lengthHelperPointer<char>("");
      other.m_size = qVar1;
      other.m_data = "";
      operator=(this,other);
    }
  }
  else {
    qVar1 = 0;
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,(qsizetype)in.m_data,(char16_t **)0x0,
               (QArrayDataPointer<char16_t> *)0x0);
    this_00 = (QLatin1 *)((this->d).ptr + (this->d).size);
    in.m_size = qVar1;
    QLatin1::convertToUnicode(this_00,out,in);
    resize(this,(long)(this_00 + ((long)in.m_data * 2 - (long)(this->d).ptr)) >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QLatin1StringView str)
{
    append_helper(*this, str);
    return *this;
}